

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void NavRestoreLayer(int layer)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = layer;
  window = pIVar2->NavWindow;
  if (layer == 0) {
    if (window->NavLastChildNavWindow != (ImGuiWindow *)0x0) {
      window = window->NavLastChildNavWindow;
    }
    pIVar2->NavWindow = window;
    IVar1 = window->NavLastIds[0];
    if (IVar1 != 0) {
      pIVar2->NavId = IVar1;
      window->NavLastIds[0] = IVar1;
      pIVar2->NavMousePosDirty = true;
      pIVar2->NavDisableHighlight = false;
      pIVar2->NavDisableMouseHover = true;
      return;
    }
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(int layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);
    if (layer == 0 && g.NavWindow->NavLastIds[0] != 0)
        SetNavIDWithRectRel(g.NavWindow->NavLastIds[0], layer, g.NavWindow->NavRectRel[0]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}